

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::ClearAttribute
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,SimpleDictionaryPropertyDescriptor<int> *descriptor,
          PropertyAttributes attribute)

{
  PropertyAttributes PVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  DynamicType *pDVar6;
  PropertyAttributes oldAttributes;
  PropertyAttributes attributes;
  PropertyAttributes attribute_local;
  SimpleDictionaryPropertyDescriptor<int> *descriptor_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_local;
  
  if ((descriptor->Attributes & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x781,"(!(descriptor->Attributes & 0x10))",
                                "!(descriptor->Attributes & PropertyLetConstGlobal)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((descriptor->Attributes & 8) != 0) {
    return 0;
  }
  bVar4 = descriptor->Attributes & (attribute ^ 0xff);
  if (bVar4 == descriptor->Attributes) {
    return 0;
  }
  bVar3 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
  if (bVar3) {
    PVar1 = descriptor->Attributes;
    descriptor->Attributes = bVar4;
    ConvertToNonSharedSimpleDictionaryType(this,instance);
    descriptor->Attributes = PVar1;
    return 1;
  }
  pDVar6 = DynamicObject::GetDynamicType(instance);
  bVar3 = DynamicType::GetIsLocked(pDVar6);
  if (!bVar3) goto LAB_0149e3d5;
  bVar3 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
  if (bVar3) {
LAB_0149e35f:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x799,
                                "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  else {
    pDVar6 = DynamicObject::GetDynamicType(instance);
    bVar3 = DynamicType::GetIsShared(pDVar6);
    if (bVar3) goto LAB_0149e35f;
  }
  DynamicObject::ChangeType(instance);
LAB_0149e3d5:
  descriptor->Attributes = bVar4;
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ClearAttribute(DynamicObject* instance, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, PropertyAttributes attribute)
    {
        Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
        if (descriptor->Attributes & PropertyDeleted)
        {
            return false;
        }

        PropertyAttributes attributes = descriptor->Attributes;
        attributes &= ~attribute;
        if (attributes == descriptor->Attributes)
        {
            return false;
        }

        if (GetIsLocked())
        {
            PropertyAttributes oldAttributes = descriptor->Attributes;
            descriptor->Attributes = attributes;
            ConvertToNonSharedSimpleDictionaryType(instance); // This changes TypeHandler, but non-necessarily Type.
            descriptor->Attributes = oldAttributes;
        }
        else
        {
            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            descriptor->Attributes = attributes;
        }
        return true;
    }